

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Main.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> *this;
  Allocator<char> *this_00;
  char *pcVar1;
  bool bVar2;
  uint uVar3;
  Opt *pOVar4;
  Opt *pOVar5;
  ostream *poVar6;
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  tVar7;
  ulong uVar8;
  size_t sVar9;
  element_type *peVar10;
  element_type *peVar11;
  basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_> *local_a90;
  thread *t;
  iterator __end1;
  iterator __begin1;
  list<std::thread,_std::allocator<std::thread>_> *__range1;
  unsigned_long local_928;
  int local_920;
  uint64_t local_918;
  shared_ptr<Jinx::IRuntime> local_910;
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  local_900;
  thread local_8f8;
  int local_8f0;
  int local_8ec;
  int n;
  int numCores;
  list<std::thread,_std::allocator<std::thread>_> threadList;
  any local_8c8;
  shared_ptr<Jinx::Buffer> local_8b8;
  undefined1 local_8a8 [8];
  ScriptPtr script;
  basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_> local_888;
  undefined1 local_868 [24];
  basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_> local_850;
  undefined1 local_830 [8];
  BufferPtr bytecode;
  undefined1 local_818 [4];
  uint i;
  RuntimePtr runtime;
  GlobalParams globalParams;
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  stopTime;
  time_point startTime;
  string local_758;
  Args local_738;
  undefined1 local_700 [8];
  InternalParseResult result;
  allocator<char> local_621;
  string local_620;
  allocator<char> local_5f9;
  string local_5f8;
  allocator<char> local_5d1;
  string local_5d0;
  allocator<char> local_5a9;
  string local_5a8;
  Opt local_588;
  allocator<char> local_509;
  string local_508;
  allocator<char> local_4e1;
  string local_4e0;
  allocator<char> local_4b9;
  string local_4b8;
  allocator<char> local_491;
  string local_490;
  Opt local_470;
  allocator<char> local_3f1;
  string local_3f0;
  allocator<char> local_3c9;
  string local_3c8;
  allocator<char> local_3a1;
  string local_3a0;
  allocator<char> local_379;
  string local_378;
  Opt local_358;
  allocator<char> local_2d9;
  string local_2d8;
  allocator<char> local_2b1;
  string local_2b0;
  allocator<char> local_289;
  string local_288;
  allocator<char> local_251;
  string local_250;
  Opt local_230;
  Parser local_1b8;
  Parser local_158;
  Parser local_f8;
  undefined1 local_98 [8];
  Parser parser;
  uint local_30;
  uint uStack_2c;
  bool showHelp;
  uint32_t hours;
  uint32_t minutes;
  uint64_t start;
  uint64_t permutations;
  char **argv_local;
  int argc_local;
  
  argv_local._4_4_ = 0;
  start = 0;
  _hours = 0;
  uStack_2c = 0;
  local_30 = 0;
  parser.m_args.super__Vector_base<clara::detail::Arg,_std::allocator<clara::detail::Arg>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._7_1_ = 0;
  permutations = (uint64_t)argv;
  argv_local._0_4_ = argc;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_250,"permutations",&local_251)
  ;
  clara::detail::Opt::Opt<unsigned_long>(&local_230,&start,&local_250);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_288,"-p",&local_289);
  pOVar4 = clara::detail::Opt::operator[](&local_230,&local_288);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2b0,"--permutations",&local_2b1);
  pOVar4 = clara::detail::Opt::operator[](pOVar4,&local_2b0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2d8,"Max number of permutations to run",&local_2d9);
  pOVar4 = clara::detail::ParserRefImpl<clara::detail::Opt>::operator()
                     (&pOVar4->super_ParserRefImpl<clara::detail::Opt>,&local_2d8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_378,"start",&local_379);
  clara::detail::Opt::Opt<unsigned_long>(&local_358,(unsigned_long *)&hours,&local_378);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_3a0,"-s",&local_3a1);
  pOVar5 = clara::detail::Opt::operator[](&local_358,&local_3a0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_3c8,"--start",&local_3c9);
  pOVar5 = clara::detail::Opt::operator[](pOVar5,&local_3c8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_3f0,"Starting permutation",&local_3f1);
  pOVar5 = clara::detail::ParserRefImpl<clara::detail::Opt>::operator()
                     (&pOVar5->super_ParserRefImpl<clara::detail::Opt>,&local_3f0);
  clara::detail::ComposableParserImpl<clara::detail::Opt>::operator|
            (&local_1b8,(ComposableParserImpl<clara::detail::Opt> *)pOVar4,pOVar5);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_490,"minutes",&local_491);
  clara::detail::Opt::Opt<unsigned_int>(&local_470,&stack0xffffffffffffffd4,&local_490);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_4b8,"-m",&local_4b9);
  pOVar4 = clara::detail::Opt::operator[](&local_470,&local_4b8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_4e0,"--minutes",&local_4e1);
  pOVar4 = clara::detail::Opt::operator[](pOVar4,&local_4e0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_508,"Minutes to run fuzz tests",&local_509);
  pOVar4 = clara::detail::ParserRefImpl<clara::detail::Opt>::operator()
                     (&pOVar4->super_ParserRefImpl<clara::detail::Opt>,&local_508);
  clara::detail::Parser::operator|(&local_158,&local_1b8,pOVar4);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_5a8,"hours",&local_5a9);
  clara::detail::Opt::Opt<unsigned_int>(&local_588,&local_30,&local_5a8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_5d0,"-h",&local_5d1);
  pOVar4 = clara::detail::Opt::operator[](&local_588,&local_5d0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_5f8,"--hours",&local_5f9);
  pOVar4 = clara::detail::Opt::operator[](pOVar4,&local_5f8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_620,"Hours to run fuzz tests",&local_621);
  pOVar4 = clara::detail::ParserRefImpl<clara::detail::Opt>::operator()
                     (&pOVar4->super_ParserRefImpl<clara::detail::Opt>,&local_620);
  clara::detail::Parser::operator|(&local_f8,&local_158,pOVar4);
  clara::detail::Help::Help
            ((Help *)((long)&result.m_errorMessage.field_2 + 8),
             (bool *)((long)&parser.m_args.
                             super__Vector_base<clara::detail::Arg,_std::allocator<clara::detail::Arg>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  clara::detail::Parser::operator|
            ((Parser *)local_98,&local_f8,(Help *)((long)&result.m_errorMessage.field_2 + 8));
  clara::detail::Help::~Help((Help *)((long)&result.m_errorMessage.field_2 + 8));
  clara::detail::Parser::~Parser(&local_f8);
  std::__cxx11::string::~string((string *)&local_620);
  std::allocator<char>::~allocator(&local_621);
  std::__cxx11::string::~string((string *)&local_5f8);
  std::allocator<char>::~allocator(&local_5f9);
  std::__cxx11::string::~string((string *)&local_5d0);
  std::allocator<char>::~allocator(&local_5d1);
  clara::detail::Opt::~Opt(&local_588);
  std::__cxx11::string::~string((string *)&local_5a8);
  std::allocator<char>::~allocator(&local_5a9);
  clara::detail::Parser::~Parser(&local_158);
  std::__cxx11::string::~string((string *)&local_508);
  std::allocator<char>::~allocator(&local_509);
  std::__cxx11::string::~string((string *)&local_4e0);
  std::allocator<char>::~allocator(&local_4e1);
  std::__cxx11::string::~string((string *)&local_4b8);
  std::allocator<char>::~allocator(&local_4b9);
  clara::detail::Opt::~Opt(&local_470);
  std::__cxx11::string::~string((string *)&local_490);
  std::allocator<char>::~allocator(&local_491);
  clara::detail::Parser::~Parser(&local_1b8);
  std::__cxx11::string::~string((string *)&local_3f0);
  std::allocator<char>::~allocator(&local_3f1);
  std::__cxx11::string::~string((string *)&local_3c8);
  std::allocator<char>::~allocator(&local_3c9);
  std::__cxx11::string::~string((string *)&local_3a0);
  std::allocator<char>::~allocator(&local_3a1);
  clara::detail::Opt::~Opt(&local_358);
  std::__cxx11::string::~string((string *)&local_378);
  std::allocator<char>::~allocator(&local_379);
  std::__cxx11::string::~string((string *)&local_2d8);
  std::allocator<char>::~allocator(&local_2d9);
  std::__cxx11::string::~string((string *)&local_2b0);
  std::allocator<char>::~allocator(&local_2b1);
  std::__cxx11::string::~string((string *)&local_288);
  std::allocator<char>::~allocator(&local_289);
  clara::detail::Opt::~Opt(&local_230);
  std::__cxx11::string::~string((string *)&local_250);
  std::allocator<char>::~allocator(&local_251);
  clara::detail::Args::Args(&local_738,(int)argv_local,(char **)permutations);
  clara::detail::ParserBase::parse
            ((InternalParseResult *)local_700,(ParserBase *)local_98,&local_738);
  clara::detail::Args::~Args(&local_738);
  bVar2 = clara::detail::BasicResult::operator_cast_to_bool((BasicResult *)local_700);
  if (bVar2) {
    if ((parser.m_args.super__Vector_base<clara::detail::Arg,_std::allocator<clara::detail::Arg>_>.
         _M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ & 1) == 0) {
      if (((start == 0) && (uStack_2c == 0)) && (local_30 == 0)) {
        start = 100000;
      }
      else {
        if (local_30 != 0) {
          uStack_2c = local_30 * 0x3c + uStack_2c;
        }
        if ((uStack_2c != 0) && (start == 0)) {
          start = 1000000000000;
        }
      }
      if (uStack_2c == 0) {
        uStack_2c = 60000;
      }
      stopTime.__d.__r = (duration)std::chrono::_V2::system_clock::now();
      std::chrono::duration<long,std::ratio<60l,1l>>::duration<unsigned_int,void>
                ((duration<long,std::ratio<60l,1l>> *)&globalParams.maxInstructions,
                 &stack0xffffffffffffffd4);
      tVar7 = std::chrono::operator+
                        (&stopTime,
                         (duration<long,_std::ratio<60L,_1L>_> *)&globalParams.maxInstructions);
      this = &runtime.super___shared_ptr<Jinx::IRuntime,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
      Jinx::GlobalParams::GlobalParams((GlobalParams *)this);
      globalParams.logFn._M_invoker._1_1_ = 0;
      globalParams.logFn._M_invoker._2_1_ = 0;
      globalParams.logFn._M_invoker._0_1_ = 0;
      Jinx::Initialize((GlobalParams *)this);
      Jinx::CreateRuntime();
      for (bytecode.super___shared_ptr<Jinx::Buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
           _4_4_ = 0;
          uVar8 = (ulong)bytecode.super___shared_ptr<Jinx::Buffer,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount._M_pi._4_4_,
          sVar9 = std::size<char_const*,33ul>(&s_testScripts), uVar8 < sVar9;
          bytecode.super___shared_ptr<Jinx::Buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
          _4_4_ = bytecode.super___shared_ptr<Jinx::Buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                  _M_pi._4_4_ + 1) {
        peVar10 = std::__shared_ptr_access<Jinx::IRuntime,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  ::operator->((__shared_ptr_access<Jinx::IRuntime,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                *)local_818);
        pcVar1 = s_testScripts
                 [bytecode.super___shared_ptr<Jinx::Buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                  _M_pi._4_4_];
        Jinx::Allocator<char>::Allocator((Allocator<char> *)(local_868 + 0x17));
        std::__cxx11::basic_string<char,std::char_traits<char>,Jinx::Allocator<char>>::
        basic_string<Jinx::Allocator<char>>
                  ((basic_string<char,std::char_traits<char>,Jinx::Allocator<char>> *)&local_850,
                   "Test Script",(Allocator<char> *)(local_868 + 0x17));
        this_00 = (Allocator<char> *)
                  ((long)&script.super___shared_ptr<Jinx::IScript,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount._M_pi + 7);
        Jinx::Allocator<char>::Allocator(this_00);
        std::__cxx11::basic_string<char,std::char_traits<char>,Jinx::Allocator<char>>::
        basic_string<Jinx::Allocator<char>>
                  ((basic_string<char,std::char_traits<char>,Jinx::Allocator<char>> *)&local_888,
                   "core",this_00);
        local_868._0_8_ = &local_888;
        local_868._8_8_ = 1;
        (**peVar10->_vptr_IRuntime)(local_830,peVar10,pcVar1,&local_850,local_868._0_8_,1);
        local_a90 = (basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_> *)local_868;
        do {
          local_a90 = local_a90 + -1;
          std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>::
          ~basic_string(local_a90);
        } while (local_a90 != &local_888);
        std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>::
        ~basic_string(&local_850);
        bVar2 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)local_830);
        if (bVar2) {
          peVar10 = std::
                    __shared_ptr_access<Jinx::IRuntime,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                    operator->((__shared_ptr_access<Jinx::IRuntime,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                *)local_818);
          std::shared_ptr<Jinx::Buffer>::shared_ptr
                    (&local_8b8,(shared_ptr<Jinx::Buffer> *)local_830);
          threadList.super__List_base<std::thread,_std::allocator<std::thread>_>._M_impl._M_node.
          _M_size = 0;
          std::any::
          any<decltype(nullptr),decltype(nullptr),std::any::_Manager_internal<decltype(nullptr)>,void>
                    (&local_8c8,
                     (void **)&threadList.
                               super__List_base<std::thread,_std::allocator<std::thread>_>._M_impl.
                               _M_node._M_size);
          (*peVar10->_vptr_IRuntime[1])(local_8a8,peVar10,&local_8b8,&local_8c8);
          std::any::~any(&local_8c8);
          std::shared_ptr<Jinx::Buffer>::~shared_ptr(&local_8b8);
          peVar11 = std::
                    __shared_ptr_access<Jinx::IScript,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                    operator->((__shared_ptr_access<Jinx::IScript,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                *)local_8a8);
          uVar3 = (**peVar11->_vptr_IScript)();
          bVar2 = (uVar3 & 1) == 0;
          if (bVar2) {
            poVar6 = std::operator<<((ostream *)&std::cerr,"Unable to execute test script #");
            poVar6 = (ostream *)
                     std::ostream::operator<<
                               (poVar6,bytecode.
                                       super___shared_ptr<Jinx::Buffer,_(__gnu_cxx::_Lock_policy)2>.
                                       _M_refcount._M_pi._4_4_);
            std::operator<<(poVar6,"\n");
            argv_local._4_4_ = -1;
          }
          std::shared_ptr<Jinx::IScript>::~shared_ptr((shared_ptr<Jinx::IScript> *)local_8a8);
        }
        else {
          poVar6 = std::operator<<((ostream *)&std::cerr,"Unable to compile test script #");
          poVar6 = (ostream *)
                   std::ostream::operator<<
                             (poVar6,bytecode.
                                     super___shared_ptr<Jinx::Buffer,_(__gnu_cxx::_Lock_policy)2>.
                                     _M_refcount._M_pi._4_4_);
          std::operator<<(poVar6,"\n");
          argv_local._4_4_ = -1;
          bVar2 = true;
        }
        std::shared_ptr<Jinx::Buffer>::~shared_ptr((shared_ptr<Jinx::Buffer> *)local_830);
        if (bVar2) goto LAB_00109fc8;
      }
      std::__cxx11::list<std::thread,_std::allocator<std::thread>_>::list
                ((list<std::thread,_std::allocator<std::thread>_> *)&n);
      local_8ec = std::thread::hardware_concurrency();
      for (local_8f0 = 0; local_8f0 < local_8ec; local_8f0 = local_8f0 + 1) {
        __range1._0_4_ = local_8f0;
        local_928 = _hours;
        local_920 = local_8ec;
        local_918 = start;
        std::shared_ptr<Jinx::IRuntime>::shared_ptr
                  (&local_910,(shared_ptr<Jinx::IRuntime> *)local_818);
        local_900 = tVar7;
        std::thread::thread<main::__0,,void>(&local_8f8,(type *)&__range1);
        std::__cxx11::list<std::thread,_std::allocator<std::thread>_>::push_back
                  ((list<std::thread,_std::allocator<std::thread>_> *)&n,&local_8f8);
        std::thread::~thread(&local_8f8);
        main::$_0::~__0((__0 *)&__range1);
      }
      __end1 = std::__cxx11::list<std::thread,_std::allocator<std::thread>_>::begin
                         ((list<std::thread,_std::allocator<std::thread>_> *)&n);
      t = (thread *)
          std::__cxx11::list<std::thread,_std::allocator<std::thread>_>::end
                    ((list<std::thread,_std::allocator<std::thread>_> *)&n);
      while (bVar2 = std::operator!=(&__end1,(_Self *)&t), bVar2) {
        std::_List_iterator<std::thread>::operator*(&__end1);
        std::thread::join();
        std::_List_iterator<std::thread>::operator++(&__end1);
      }
      std::__cxx11::list<std::thread,_std::allocator<std::thread>_>::clear
                ((list<std::thread,_std::allocator<std::thread>_> *)&n);
      argv_local._4_4_ = 0;
      std::__cxx11::list<std::thread,_std::allocator<std::thread>_>::~list
                ((list<std::thread,_std::allocator<std::thread>_> *)&n);
LAB_00109fc8:
      std::shared_ptr<Jinx::IRuntime>::~shared_ptr((shared_ptr<Jinx::IRuntime> *)local_818);
      Jinx::GlobalParams::~GlobalParams
                ((GlobalParams *)
                 &runtime.super___shared_ptr<Jinx::IRuntime,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                );
    }
    else {
      clara::detail::Parser::writeToStream((Parser *)local_98,(ostream *)&std::cout);
      argv_local._4_4_ = 0;
    }
  }
  else {
    poVar6 = std::operator<<((ostream *)&std::cerr,"Error in command line: ");
    clara::detail::BasicResult<clara::detail::ParseState>::errorMessage_abi_cxx11_
              (&local_758,(BasicResult<clara::detail::ParseState> *)local_700);
    poVar6 = std::operator<<(poVar6,(string *)&local_758);
    std::operator<<(poVar6,"\n");
    std::__cxx11::string::~string((string *)&local_758);
    argv_local._4_4_ = -1;
  }
  clara::detail::BasicResult<clara::detail::ParseState>::~BasicResult
            ((BasicResult<clara::detail::ParseState> *)local_700);
  clara::detail::Parser::~Parser((Parser *)local_98);
  return argv_local._4_4_;
}

Assistant:

int main(int argc, char * argv[])
{
	// Handle command-line options
	uint64_t permutations = 0;
	uint64_t start = 0;
	uint32_t minutes = 0;
	uint32_t hours = 0;
	bool showHelp = false;
	auto parser =
		Opt(permutations, "permutations")["-p"]["--permutations"]("Max number of permutations to run") |
		Opt(start, "start")["-s"]["--start"]("Starting permutation") |
		Opt(minutes, "minutes")["-m"]["--minutes"]("Minutes to run fuzz tests") |
		Opt(hours, "hours")["-h"]["--hours"]("Hours to run fuzz tests") |
		Help(showHelp);

	auto result = parser.parse(Args(argc, argv));
	if (!result)
	{
		std::cerr << "Error in command line: " << result.errorMessage() << "\n";
		return -1;
	}
	else if (showHelp)
	{
		parser.writeToStream(std::cout);
		return 0;
	}

	// Set max permutations and/or time to run
	if (!permutations && !minutes && !hours)
	{
		// Pick a default number of permutations to run if no arguments are passed
		permutations = 100'000;

	}
	else
	{
		// Convert hours to minutes
		if (hours)
			minutes += (hours * 60);

		if (minutes)
		{
			// If permutation limit hasn't been specified
			if (!permutations)
				permutations = 1'000'000'000'000;
		}
	}

	if (!minutes)
	{
		// If time isn't specified, set max time to 1000 hours
		minutes = 60 * 1000;
	}

	// Start timer
	const auto startTime = std::chrono::system_clock::now();
	const auto stopTime = startTime + std::chrono::minutes(minutes);

	// Initialize Jinx and
	Jinx::GlobalParams globalParams;
	globalParams.logSymbols = false;
	globalParams.logBytecode = false;
	globalParams.enableLogging = false;
	Jinx::Initialize(globalParams);
	auto runtime = CreateRuntime();

	// Validate that all scripts compile and execute successfully
	for (auto i = 0u; i < std::size(s_testScripts); ++i)
	{
		// Compile the text to bytecode
		auto bytecode = runtime->Compile(s_testScripts[i], "Test Script", { "core" });
		if (!bytecode)
		{
			std::cerr << "Unable to compile test script #" << i << "\n";
			return -1;
		}

		// Create a runtime script with the given bytecode
		auto script = runtime->CreateScript(bytecode);
		
		if (!script->Execute())
		{
			std::cerr << "Unable to execute test script #" << i << "\n";
			return -1;
		}
	}

	std::list<std::thread> threadList;
	int numCores = std::thread::hardware_concurrency();
	for (int n = 0; n < numCores; ++n)
	{
		threadList.push_back(std::thread([n, start, numCores, permutations, runtime, stopTime]()
		{
			Fuzzer sourceFuzzer;
			for (uint64_t j = n; j < permutations; j += numCores)
			{
				if (std::chrono::system_clock::now() > stopTime)
					break;
				for (int i = 0; i < static_cast<int>(std::size(s_testScripts)); ++i)
				{
					// Compile the text to bytecode
					auto bytecode = runtime->Compile(sourceFuzzer.Fuzz(s_testScripts[i], j + start), "Test Script");
					if (!bytecode)
						continue;

					// Create and execute the script if viable
					auto script = runtime->CreateScript(bytecode);
					if (!script)
						continue;
					do
					{
						if (!script->Execute())
							break;
					}
					while (!script->IsFinished());
				}
				auto stats = Jinx::GetMemoryStats();
				printf("Permutation %" PRIu64 " (Allocated Memory = %" PRIu64 " KB)\n", j + start, stats.allocatedMemory / 1024);
			}
		}));
	}

	// Wait for all threads to finish
	for (auto & t : threadList)
		t.join();
	threadList.clear();

	return 0;
}